

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void duckdb_parquet::swap(DataPageHeader *a,DataPageHeader *b)

{
  Statistics *in_RSI;
  long in_RDI;
  Statistics *in_stack_ffffffffffffffe8;
  
  std::swap<int>((int *)(in_RDI + 8),(int *)&in_RSI->max);
  std::swap<duckdb_parquet::Encoding::type>((type *)(in_RDI + 0xc),(type *)&(in_RSI->max).field_0x4)
  ;
  std::swap<duckdb_parquet::Encoding::type>
            ((type *)(in_RDI + 0x10),(type *)&(in_RSI->max)._M_string_length);
  std::swap<duckdb_parquet::Encoding::type>
            ((type *)(in_RDI + 0x14),(type *)((long)&(in_RSI->max)._M_string_length + 4));
  swap(in_RSI,in_stack_ffffffffffffffe8);
  std::swap<duckdb_parquet::_DataPageHeader__isset>
            ((_DataPageHeader__isset *)(in_RDI + 0xb8),
             (_DataPageHeader__isset *)in_RSI[1].max.field_2._M_local_buf);
  return;
}

Assistant:

void swap(DataPageHeader &a, DataPageHeader &b) {
  using ::std::swap;
  swap(a.num_values, b.num_values);
  swap(a.encoding, b.encoding);
  swap(a.definition_level_encoding, b.definition_level_encoding);
  swap(a.repetition_level_encoding, b.repetition_level_encoding);
  swap(a.statistics, b.statistics);
  swap(a.__isset, b.__isset);
}